

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt1RevSubClampPalCommand::Execute
          (DrawColumnRt1RevSubClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  
  iVar7 = (this->super_PalRtCommand).yl;
  iVar7 = DrawerThread::count_for_thread(thread,iVar7,((this->super_PalRtCommand).yh - iVar7) + 1);
  if (0 < iVar7) {
    puVar3 = (this->super_PalRtCommand)._srcblend;
    puVar4 = (this->super_PalRtCommand)._destblend;
    iVar1 = (this->super_PalRtCommand).yl;
    iVar8 = DrawerThread::skipped_by_thread(thread,iVar1);
    pbVar13 = (this->super_PalRtCommand)._destorg +
              (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar8 + iVar1];
    puVar5 = thread->dc_temp;
    iVar9 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    iVar1 = *(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc;
    iVar8 = (this->super_PalRtCommand)._pitch;
    iVar2 = thread->num_cores;
    puVar6 = (this->super_PalRtCommand)._colormap;
    lVar10 = 0;
    do {
      uVar11 = (puVar4[*pbVar13] | 0x40100400) -
               puVar3[puVar6[puVar5[lVar10 * 4 + (long)(iVar9 * 4 + iVar1)]]];
      uVar12 = uVar11 & 0x40100400;
      uVar11 = uVar12 - (uVar12 >> 5) & uVar11 | 0x1f07c1f;
      *pbVar13 = RGB32k.All[uVar11 >> 0xf & uVar11];
      pbVar13 = pbVar13 + (long)iVar2 * (long)iVar8;
      lVar10 = lVar10 + 1;
    } while (iVar7 != (int)lVar10);
  }
  return;
}

Assistant:

void DrawColumnRt1RevSubClampPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t a = (bg2rgb[*dest] | 0x40100400) - fg2rgb[colormap[*source]];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[(a>>15) & a];
			source += 4;
			dest += pitch;
		} while (--count);
	}